

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

int FIX::double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  bool bVar1;
  int iVar2;
  Chunk CVar3;
  Chunk CVar4;
  Chunk bigit_b;
  Chunk bigit_a;
  int i;
  int bigit_length_b;
  int bigit_length_a;
  Bignum *b_local;
  Bignum *a_local;
  
  bVar1 = IsClamped(a);
  if (!bVar1) {
    __assert_fail("a.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x26b,
                  "static int FIX::double_conversion::Bignum::Compare(const Bignum &, const Bignum &)"
                 );
  }
  bVar1 = IsClamped(b);
  if (!bVar1) {
    __assert_fail("b.IsClamped()",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x26c,
                  "static int FIX::double_conversion::Bignum::Compare(const Bignum &, const Bignum &)"
                 );
  }
  bigit_b = BigitLength(a);
  iVar2 = BigitLength(b);
  if ((int)bigit_b < iVar2) {
    a_local._4_4_ = -1;
  }
  else if (iVar2 < (int)bigit_b) {
    a_local._4_4_ = 1;
  }
  else {
    do {
      bigit_b = bigit_b - 1;
      iVar2 = Min<int>(a->exponent_,b->exponent_);
      if ((int)bigit_b < iVar2) {
        return 0;
      }
      CVar3 = BigitAt(a,bigit_b);
      CVar4 = BigitAt(b,bigit_b);
      if (CVar3 < CVar4) {
        return -1;
      }
    } while (CVar3 <= CVar4);
    a_local._4_4_ = 1;
  }
  return a_local._4_4_;
}

Assistant:

int Bignum::Compare(const Bignum& a, const Bignum& b) {
  ASSERT(a.IsClamped());
  ASSERT(b.IsClamped());
  int bigit_length_a = a.BigitLength();
  int bigit_length_b = b.BigitLength();
  if (bigit_length_a < bigit_length_b) return -1;
  if (bigit_length_a > bigit_length_b) return +1;
  for (int i = bigit_length_a - 1; i >= Min(a.exponent_, b.exponent_); --i) {
    Chunk bigit_a = a.BigitAt(i);
    Chunk bigit_b = b.BigitAt(i);
    if (bigit_a < bigit_b) return -1;
    if (bigit_a > bigit_b) return +1;
    // Otherwise they are equal up to this digit. Try the next digit.
  }
  return 0;
}